

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool __thiscall helics::InputInfo::updateTimeNextIteration(InputInfo *this,Time newTime)

{
  pointer pvVar1;
  dataRecord *pdVar2;
  long lVar3;
  dataRecord *pdVar4;
  bool bVar5;
  bool bVar6;
  int index;
  const_iterator __last;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *data_queue;
  pointer this_00;
  
  this_00 = (this->data_queues).
            super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->data_queues).
           super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  index = 0;
  do {
    if (this_00 == pvVar1) {
      return bVar6;
    }
    __last._M_current =
         (this_00->
         super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (this_00->
             super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((__last._M_current != pdVar2) &&
       (((__last._M_current)->time).internalTimeCode <= newTime.internalTimeCode)) {
      do {
        pdVar4 = __last._M_current;
        __last._M_current = pdVar4 + 1;
        if (__last._M_current == pdVar2) goto LAB_0026f027;
        lVar3 = ((__last._M_current)->time).internalTimeCode;
      } while (lVar3 < newTime.internalTimeCode);
      if (lVar3 == newTime.internalTimeCode) {
        for (; ((__last._M_current != pdVar2 &&
                (((__last._M_current)->time).internalTimeCode == newTime.internalTimeCode)) &&
               ((__last._M_current)->iteration == pdVar4->iteration));
            __last._M_current = __last._M_current + 1) {
        }
      }
LAB_0026f027:
      bVar5 = updateData(this,__last._M_current + -1,index);
      std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
      erase(this_00,(this_00->
                    super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    )._M_impl.super__Vector_impl_data._M_start,__last);
      bVar6 = (bool)(bVar6 | bVar5);
    }
    index = index + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

bool InputInfo::updateTimeNextIteration(Time newTime)
{
    int index{0};
    bool updated{false};
    for (auto& data_queue : data_queues) {
        auto currentValue = data_queue.begin();
        auto it_final = data_queue.end();
        if (currentValue == it_final) {
            ++index;
            continue;
        }
        if (currentValue->time > newTime) {
            ++index;
            continue;
        }
        auto last = currentValue;
        ++currentValue;
        while ((currentValue != it_final) && (currentValue->time < newTime)) {
            last = currentValue;
            ++currentValue;
        }
        if (currentValue != it_final) {
            if (currentValue->time == newTime) {
                auto cindex = last->iteration;
                while ((currentValue != it_final) && (currentValue->time == newTime) &&
                       (currentValue->iteration == cindex)) {
                    last = currentValue;
                    ++currentValue;
                }
            }
        }

        auto res = updateData(std::move(*last), index);
        data_queue.erase(data_queue.begin(), currentValue);
        ++index;
        if (res) {
            updated = true;
        }
    }
    return updated;
}